

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_utils.c
# Opt level: O0

void CGTFS_FileUtils(void)

{
  int iVar1;
  greatest_test_res local_40;
  greatest_test_res local_3c;
  greatest_test_res res_13;
  greatest_test_res res_12;
  greatest_test_res res_11;
  greatest_test_res res_10;
  greatest_test_res res_9;
  greatest_test_res res_8;
  greatest_test_res res_7;
  greatest_test_res res_6;
  greatest_test_res res_5;
  greatest_test_res res_4;
  greatest_test_res res_3;
  greatest_test_res res_2;
  greatest_test_res res_1;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("file_utils_read_header_0");
  if (iVar1 == 1) {
    res_2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_2 == GREATEST_TEST_RES_PASS) {
      res_2 = file_utils_read_header_0();
    }
    greatest_test_post(res_2);
  }
  iVar1 = greatest_test_pre("file_utils_read_header_1");
  if (iVar1 == 1) {
    res_3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_3 == GREATEST_TEST_RES_PASS) {
      res_3 = file_utils_read_header_1();
    }
    greatest_test_post(res_3);
  }
  iVar1 = greatest_test_pre("file_utils_read_header_2_empty");
  if (iVar1 == 1) {
    res_4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_4 == GREATEST_TEST_RES_PASS) {
      res_4 = file_utils_read_header_2_empty();
    }
    greatest_test_post(res_4);
  }
  iVar1 = greatest_test_pre("file_utils_read_header_3_badfile");
  if (iVar1 == 1) {
    res_5 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_5 == GREATEST_TEST_RES_PASS) {
      res_5 = file_utils_read_header_3_badfile();
    }
    greatest_test_post(res_5);
  }
  iVar1 = greatest_test_pre("file_utils_read_record_0");
  if (iVar1 == 1) {
    res_6 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_6 == GREATEST_TEST_RES_PASS) {
      res_6 = file_utils_read_record_0();
    }
    greatest_test_post(res_6);
  }
  iVar1 = greatest_test_pre("file_utils_read_record_1_empty");
  if (iVar1 == 1) {
    res_7 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_7 == GREATEST_TEST_RES_PASS) {
      res_7 = file_utils_read_record_1_empty();
    }
    greatest_test_post(res_7);
  }
  iVar1 = greatest_test_pre("file_utils_read_record_2_badfile");
  if (iVar1 == 1) {
    res_8 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_8 == GREATEST_TEST_RES_PASS) {
      res_8 = file_utils_read_record_2_badfile();
    }
    greatest_test_post(res_8);
  }
  iVar1 = greatest_test_pre("file_utils_count_lines_0");
  if (iVar1 == 1) {
    res_9 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_9 == GREATEST_TEST_RES_PASS) {
      res_9 = file_utils_count_lines_0();
    }
    greatest_test_post(res_9);
  }
  iVar1 = greatest_test_pre("file_utils_count_lines_1");
  if (iVar1 == 1) {
    res_10 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_10 == GREATEST_TEST_RES_PASS) {
      res_10 = file_utils_count_lines_1();
    }
    greatest_test_post(res_10);
  }
  iVar1 = greatest_test_pre("file_utils_count_lines_2");
  if (iVar1 == 1) {
    res_11 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_11 == GREATEST_TEST_RES_PASS) {
      res_11 = file_utils_count_lines_2();
    }
    greatest_test_post(res_11);
  }
  iVar1 = greatest_test_pre("file_utils_count_lines_3_badfile");
  if (iVar1 == 1) {
    res_12 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_12 == GREATEST_TEST_RES_PASS) {
      res_12 = file_utils_count_lines_3_badfile();
    }
    greatest_test_post(res_12);
  }
  iVar1 = greatest_test_pre("file_utils_list_files_1");
  if (iVar1 == 1) {
    res_13 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_13 == GREATEST_TEST_RES_PASS) {
      res_13 = file_utils_list_files_1();
    }
    greatest_test_post(res_13);
  }
  iVar1 = greatest_test_pre("file_utils_list_files_2_nofiles");
  if (iVar1 == 1) {
    local_3c = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_3c == GREATEST_TEST_RES_PASS) {
      local_3c = file_utils_list_files_2_nofiles();
    }
    greatest_test_post(local_3c);
  }
  iVar1 = greatest_test_pre("file_utils_list_files_3_nodir");
  if (iVar1 == 1) {
    local_40 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_40 == GREATEST_TEST_RES_PASS) {
      local_40 = file_utils_list_files_3_nodir();
    }
    greatest_test_post(local_40);
  }
  return;
}

Assistant:

SUITE(CGTFS_FileUtils) {
    RUN_TEST(file_utils_read_header_0);
    RUN_TEST(file_utils_read_header_1);
    RUN_TEST(file_utils_read_header_2_empty);
    RUN_TEST(file_utils_read_header_3_badfile);

    RUN_TEST(file_utils_read_record_0);
    RUN_TEST(file_utils_read_record_1_empty);
    RUN_TEST(file_utils_read_record_2_badfile);

    RUN_TEST(file_utils_count_lines_0);
    RUN_TEST(file_utils_count_lines_1);
    RUN_TEST(file_utils_count_lines_2);
    RUN_TEST(file_utils_count_lines_3_badfile);

    RUN_TEST(file_utils_list_files_1);
    RUN_TEST(file_utils_list_files_2_nofiles);
    RUN_TEST(file_utils_list_files_3_nodir);
}